

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::Vector<unsigned_char>::~Vector(Vector<unsigned_char> *this)

{
  uchar *puVar1;
  RemoveConst<unsigned_char> *pRVar2;
  uchar *puVar3;
  ArrayDisposer *pAVar4;
  
  puVar1 = (this->builder).ptr;
  if (puVar1 != (uchar *)0x0) {
    pRVar2 = (this->builder).pos;
    puVar3 = (this->builder).endPtr;
    (this->builder).ptr = (uchar *)0x0;
    (this->builder).pos = (RemoveConst<unsigned_char> *)0x0;
    (this->builder).endPtr = (uchar *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,puVar1,1,(long)pRVar2 - (long)puVar1,(long)puVar3 - (long)puVar1,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }